

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

string * __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::New_abi_cxx11_
          (RepeatedPtrFieldStringAccessor *this,Value *param_1)

{
  string *this_00;
  Value *param_1_local;
  RepeatedPtrFieldStringAccessor *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  return this_00;
}

Assistant:

std::string* New(const Value*) const override { return new std::string(); }